

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O1

void wr_stores(void)

{
  _Bool _Var1;
  uint8_t v;
  store *store;
  long lVar2;
  object *obj;
  
  wr_u16b(z_info->store_max);
  if (0 < world->num_towns) {
    lVar2 = 0;
    do {
      for (store = world->towns[lVar2].stores; store != (store *)0x0; store = store->next) {
        _Var1 = store_is_home(store);
        v = 0xff;
        if (!_Var1) {
          v = (uint8_t)store->owner->oidx;
        }
        wr_byte(v);
        wr_byte(store->stock_num);
        for (obj = store->stock; obj != (object *)0x0; obj = obj->next) {
          wr_item(obj->known);
          wr_item(obj);
        }
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < world->num_towns);
  }
  return;
}

Assistant:

void wr_stores(void)
{
	int i;

	wr_u16b(z_info->store_max);
	for (i = 0; i < world->num_towns; i++) {
		struct town *town = &world->towns[i];
		struct store *store = town->stores;
		while (store) {
			struct object *obj;

			/* Save the current owner */
			if (store_is_home(store))
				wr_byte(-1);
			else
				wr_byte(store->owner->oidx);

			/* Save the stock size */
			wr_byte(store->stock_num);

			/* Save the stock */
			for (obj = store->stock; obj; obj = obj->next) {
				wr_item(obj->known);
				wr_item(obj);
			}
			store = store->next;
		}
	}
}